

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Point *p)

{
  ostream *poVar1;
  
  std::operator<<(os,"Point: ");
  poVar1 = std::ostream::_M_insert<double>(p->v[0]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(p->v[1]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(p->v[2]);
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream & operator<<( std::ostream & os, const Point & p)
{
	os << "Point: " << p(0) << " " << p(1) << " " << p(2) << std::endl;
	return os;
}